

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void __thiscall common_log::common_log(common_log *this,size_t capacity)

{
  pointer pcVar1;
  long lVar2;
  common_log_entry *entry;
  pointer pcVar3;
  vector<common_log_entry,_std::allocator<common_log_entry>_> *__range1;
  
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->thrd)._M_id._M_thread = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 8) = 0;
  std::condition_variable::condition_variable(&this->cv);
  (this->entries).super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->entries).super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entries).super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cur).msg.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->cur).msg.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->cur).msg.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->file = (FILE *)0x0;
  *(undefined4 *)((long)&this->file + 7) = 0;
  lVar2 = std::chrono::_V2::system_clock::now();
  this->t_start = lVar2 / 1000;
  std::vector<common_log_entry,_std::allocator<common_log_entry>_>::resize(&this->entries,capacity);
  pcVar1 = (this->entries).super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pcVar3 = (this->entries).
                super__Vector_base<common_log_entry,_std::allocator<common_log_entry>_>._M_impl.
                super__Vector_impl_data._M_start; pcVar3 != pcVar1; pcVar3 = pcVar3 + 1) {
    std::vector<char,_std::allocator<char>_>::resize(&pcVar3->msg,0x100);
  }
  this->head = 0;
  this->tail = 0;
  resume(this);
  return;
}

Assistant:

common_log(size_t capacity) {
        file = nullptr;
        prefix = false;
        timestamps = false;
        running = false;
        t_start = t_us();

        // initial message size - will be expanded if longer messages arrive
        entries.resize(capacity);
        for (auto & entry : entries) {
            entry.msg.resize(256);
        }

        head = 0;
        tail = 0;

        resume();
    }